

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcColourRgb::~IfcColourRgb(IfcColourRgb *this)

{
  ~IfcColourRgb((IfcColourRgb *)&this[-1].super_IfcColourSpecification.field_0x40);
  return;
}

Assistant:

IfcColourRgb() : Object("IfcColourRgb") {}